

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url_parser.c
# Opt level: O2

int http_parser_parse_url(char *buf,size_t buflen,int is_connect,http_parser_url *u)

{
  uint16_t *puVar1;
  byte bVar2;
  ushort uVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  char *pcVar7;
  ulong uVar8;
  ulong uVar9;
  uint uVar10;
  char *pcVar11;
  uint uVar12;
  uint16_t uVar13;
  long lVar14;
  uint uVar15;
  
  if (buflen == 0) {
    return 1;
  }
  u->field_set = 0;
  u->port = 0;
  iVar6 = (uint)(is_connect != 0) * 4 + 0x14;
  lVar14 = 0;
  uVar12 = 0;
  bVar4 = false;
  uVar15 = 7;
  do {
    if (buf + buflen <= buf + lVar14) {
      if (((ushort)uVar12 & 3) != 1) {
        if ((uVar12 & 2) != 0) {
          uVar3 = u->field_data[1].len;
          uVar9 = (ulong)u->field_data[1].off;
          u->field_data[1].len = 0;
          iVar6 = (uint)!bVar4 * 2 + 2;
          lVar14 = uVar3 + uVar9;
          uVar13 = 0;
          for (; buf + uVar9 < buf + lVar14; uVar9 = uVar9 + 1) {
            bVar2 = buf[uVar9];
            if (bVar2 == 0x5b) {
              iVar6 = 5;
            }
            else {
              if ((0x19 < (byte)((bVar2 | 0x20) + 0x9f)) &&
                 (1 < (byte)(bVar2 - 0x2d) && 9 < (byte)(bVar2 - 0x30))) {
                return 1;
              }
              u->field_data[1].off = (uint16_t)uVar9;
              uVar13 = uVar13 + 1;
              u->field_data[1].len = uVar13;
              iVar6 = 6;
            }
          }
          if ((iVar6 - 2U < 10) && ((0x3afU >> (iVar6 - 2U & 0x1f) & 1) != 0)) {
            return 1;
          }
        }
        if (is_connect == 0) {
          if ((uVar12 & 4) == 0) {
            return 0;
          }
        }
        else if ((ushort)uVar12 != 6) {
          return 1;
        }
        uVar8 = (ulong)u->field_data[2].off;
        uVar9 = (ulong)u->field_data[2].len;
        if (buflen < uVar9 + uVar8) {
          __assert_fail("off + len <= buflen && \"Port number overflow\"",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/winlibs[P]nghttp2/third-party/url-parser/url_parser.c"
                        ,0x27c,
                        "int http_parser_parse_url(const char *, size_t, int, struct http_parser_url *)"
                       );
        }
        pcVar11 = buf + uVar8;
        pcVar7 = pcVar11 + uVar9;
        uVar9 = 0;
        do {
          if (pcVar7 <= pcVar11) {
            u->port = (uint16_t)uVar9;
            return 0;
          }
          uVar9 = (uVar9 * 10 + (long)*pcVar11) - 0x30;
          pcVar11 = pcVar11 + 1;
        } while (uVar9 < 0x10000);
      }
      return 1;
    }
    bVar2 = buf[lVar14];
    uVar9 = (ulong)bVar2;
    if ((bVar2 < 0x21) && ((0x100003600U >> (uVar9 & 0x3f) & 1) != 0)) {
      return 1;
    }
    bVar5 = bVar4;
    switch((long)&switchD_00107e00::switchdataD_0010c390 +
           (long)(int)(&switchD_00107e00::switchdataD_0010c390)[iVar6 - 0x14]) {
    case 0x107e02:
      if (uVar9 == 0x2f) goto LAB_00107f60;
      if (bVar2 != 0x3f) {
        iVar6 = 0x1a;
        uVar10 = 1;
        bVar5 = true;
        if (bVar2 != 0x40) {
          if ((((byte)(bVar2 - 0x30) < 10) || ((byte)((bVar2 | 0x20) + 0x9f) < 0x1a)) ||
             ((bVar2 - 0x21 < 0x3f &&
              ((0x5400000016003ff9U >> ((ulong)(bVar2 - 0x21) & 0x3f) & 1) != 0)))) {
            iVar6 = 0x19;
            uVar10 = 1;
            bVar5 = bVar4;
          }
          else {
            iVar6 = 0x19;
            uVar10 = 1;
            bVar5 = bVar4;
            if (bVar2 != 0x7e) {
              return 1;
            }
          }
        }
        goto LAB_00107f9c;
      }
      iVar6 = 0x1c;
      uVar10 = uVar15;
      break;
    case 0x107f14:
      if ((uVar9 == 0x2a) || (bVar2 == 0x2f)) {
LAB_00107f60:
        iVar6 = 0x1b;
        uVar10 = 3;
      }
      else {
        if (0x19 < (byte)((bVar2 | 0x20) + 0x9f)) {
          return 1;
        }
        uVar10 = 0;
        iVar6 = 0x15;
      }
LAB_00107f9c:
      bVar4 = bVar5;
      if (uVar10 == uVar15) {
        puVar1 = &u->field_data[uVar15].len;
        *puVar1 = *puVar1 + 1;
        uVar10 = uVar15;
      }
      else {
        u->field_data[uVar10].off = (uint16_t)lVar14;
        u->field_data[uVar10].len = 1;
        uVar12 = uVar12 | 1 << uVar10;
        u->field_set = (uint16_t)uVar12;
      }
    }
    lVar14 = lVar14 + 1;
    uVar15 = uVar10;
  } while( true );
}

Assistant:

int
http_parser_parse_url(const char *buf, size_t buflen, int is_connect,
                      struct http_parser_url *u)
{
  enum state s;
  const char *p;
  enum http_parser_url_fields uf, old_uf;
  int found_at = 0;

  if (buflen == 0) {
    return 1;
  }

  u->port = u->field_set = 0;
  s = is_connect ? s_req_server_start : s_req_spaces_before_url;
  old_uf = UF_MAX;

  for (p = buf; p < buf + buflen; p++) {
    s = parse_url_char(s, *p);

    /* Figure out the next field that we're operating on */
    switch (s) {
      case s_dead:
        return 1;

      /* Skip delimeters */
      case s_req_schema_slash:
      case s_req_schema_slash_slash:
      case s_req_server_start:
      case s_req_query_string_start:
      case s_req_fragment_start:
        continue;

      case s_req_schema:
        uf = UF_SCHEMA;
        break;

      case s_req_server_with_at:
        found_at = 1;

      /* fall through */
      case s_req_server:
        uf = UF_HOST;
        break;

      case s_req_path:
        uf = UF_PATH;
        break;

      case s_req_query_string:
        uf = UF_QUERY;
        break;

      case s_req_fragment:
        uf = UF_FRAGMENT;
        break;

      default:
        assert(!"Unexpected state");
        return 1;
    }

    /* Nothing's changed; soldier on */
    if (uf == old_uf) {
      u->field_data[uf].len++;
      continue;
    }

    u->field_data[uf].off = (uint16_t)(p - buf);
    u->field_data[uf].len = 1;

    u->field_set |= (1 << uf);
    old_uf = uf;
  }

  /* host must be present if there is a schema */
  /* parsing http:///toto will fail */
  if ((u->field_set & (1 << UF_SCHEMA)) &&
      (u->field_set & (1 << UF_HOST)) == 0) {
    return 1;
  }

  if (u->field_set & (1 << UF_HOST)) {
    if (http_parse_host(buf, u, found_at) != 0) {
      return 1;
    }
  }

  /* CONNECT requests can only contain "hostname:port" */
  if (is_connect && u->field_set != ((1 << UF_HOST)|(1 << UF_PORT))) {
    return 1;
  }

  if (u->field_set & (1 << UF_PORT)) {
    uint16_t off;
    uint16_t len;
    const char* p;
    const char* end;
    unsigned long v;

    off = u->field_data[UF_PORT].off;
    len = u->field_data[UF_PORT].len;
    end = buf + off + len;

    /* NOTE: The characters are already validated and are in the [0-9] range */
    assert(off + len <= buflen && "Port number overflow");
    v = 0;
    for (p = buf + off; p < end; p++) {
      v *= 10;
      v += *p - '0';

      /* Ports have a max value of 2^16 */
      if (v > 0xffff) {
        return 1;
      }
    }

    u->port = (uint16_t) v;
  }

  return 0;
}